

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O1

bool __thiscall Rml::DataViewClass::Update(DataViewClass *this,DataModel *model)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  Element *element;
  String *class_name;
  byte bVar4;
  Variant variant;
  DataExpressionInterface expr_interface;
  bool local_61;
  Variant local_60;
  DataExpressionInterface local_38;
  
  Variant::Variant(&local_60);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_38,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    if ((this->super_DataViewCommon).expression._M_t.
        super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>._M_t.
        super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>.
        super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl == (DataExpression *)0x0) {
      bVar2 = Assert("RMLUI_ASSERT(expression)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                     ,0x4f);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    bVar2 = DataExpression::Run((this->super_DataViewCommon).expression._M_t.
                                super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                                .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl,
                                &local_38,&local_60);
    if (bVar2) {
      local_61 = false;
      Variant::GetInto<bool,_0>(&local_60,&local_61);
      bVar2 = local_61;
      class_name = &(this->super_DataViewCommon).modifier;
      bVar3 = Element::IsClassSet(element,class_name);
      bVar4 = bVar3 ^ bVar2;
      if (bVar4 == 1) {
        bVar4 = 1;
        Element::SetClass(element,class_name,bVar2);
      }
      goto LAB_0020495d;
    }
  }
  bVar4 = 0;
LAB_0020495d:
  Variant::~Variant(&local_60);
  return (bool)bVar4;
}

Assistant:

bool DataViewClass::Update(DataModel& model)
{
	const String& class_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const bool activate = variant.Get<bool>();
		const bool is_set = element->IsClassSet(class_name);
		if (activate != is_set)
		{
			element->SetClass(class_name, activate);
			result = true;
		}
	}
	return result;
}